

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_base_z2_row_access<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false>>>
               (void)

{
  pointer pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint rowIndex;
  pointer witness;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>
  m;
  allocator_type local_109;
  void *local_108 [2];
  _Base_ptr local_f8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_d8;
  uint local_b8 [6];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_a0;
  undefined1 local_88 [16];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_78;
  Index local_40;
  pool<boost::default_user_allocator_malloc_free> *local_38;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false>>>>
            ();
  local_88._0_8_ = operator_new(0x38);
  (((Entry_constructor *)
   &((pool<boost::default_user_allocator_malloc_free> *)local_88._0_8_)->
    super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_88._0_8_)->list).ptr = (char *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_88._0_8_)->list).sz = 0;
  ((pool<boost::default_user_allocator_malloc_free> *)local_88._0_8_)->requested_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_88._0_8_)->next_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_88._0_8_)->start_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_88._0_8_)->max_size = 0;
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false>>>
  ::Base_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false>>>
              *)(local_88 + 8),&local_a0,(Column_settings *)local_88._0_8_);
  local_d8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>
        *)0x0;
  local_d8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>
        *)0x0;
  local_d8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8[0] = 3;
  local_b8[1] = 6;
  local_b8[2] = 9;
  local_b8[3] = 10;
  local_b8[4] = 0xb;
  __l._M_len = 5;
  __l._M_array = local_b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108,__l,&local_109);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_d8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((pointer)local_108[0] != (pointer)0x0) {
    operator_delete(local_108[0],(long)local_f8 - (long)local_108[0]);
  }
  local_b8[0] = 3;
  local_b8[1] = 5;
  local_b8[2] = 8;
  local_b8[3] = 9;
  local_b8[4] = 0xb;
  __l_00._M_len = 5;
  __l_00._M_array = local_b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108,__l_00,&local_109);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_d8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((pointer)local_108[0] != (pointer)0x0) {
    operator_delete(local_108[0],(long)local_f8 - (long)local_108[0]);
  }
  local_b8[0] = 5;
  local_b8[1] = 8;
  __l_01._M_len = 2;
  __l_01._M_array = local_b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108,__l_01,&local_109);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_d8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((pointer)local_108[0] != (pointer)0x0) {
    operator_delete(local_108[0],(long)local_f8 - (long)local_108[0]);
  }
  local_b8[0] = 7;
  __l_02._M_len = 1;
  __l_02._M_array = local_b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108,__l_02,&local_109);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_d8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((pointer)local_108[0] != (pointer)0x0) {
    operator_delete(local_108[0],(long)local_f8 - (long)local_108[0]);
  }
  local_b8[0] = 3;
  local_b8[1] = 6;
  local_b8[2] = 7;
  local_b8[3] = 9;
  local_b8[4] = 10;
  local_b8[5] = 0xb;
  __l_03._M_len = 6;
  __l_03._M_array = local_b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108,__l_03,&local_109);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_d8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((pointer)local_108[0] != (pointer)0x0) {
    operator_delete(local_108[0],(long)local_f8 - (long)local_108[0]);
  }
  local_b8[0] = 7;
  __l_04._M_len = 1;
  __l_04._M_array = local_b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108,__l_04,&local_109);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_d8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((pointer)local_108[0] != (pointer)0x0) {
    operator_delete(local_108[0],(long)local_f8 - (long)local_108[0]);
  }
  pvVar1 = local_d8.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    rowIndex = 0;
    witness = local_d8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      get_ordered_row<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false>>>
                ((column_content<typename_Matrix<Base_options_with_row_access<true,_(Column_types)7,_false,_false,_true,_false>_>::Column>
                  *)local_108,
                 (Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>
                  *)local_88,rowIndex);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false>>>>
                (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>
                          *)local_108);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_108);
      witness = witness + 1;
      rowIndex = rowIndex + 1;
    } while (witness != pvVar1);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_d8);
  uVar2 = local_88._0_8_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&local_78);
  uVar3 = local_88._0_8_;
  local_40 = 0;
  local_38 = (pool<boost::default_user_allocator_malloc_free> *)uVar2;
  if ((pool<boost::default_user_allocator_malloc_free> *)local_88._0_8_ !=
      (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)local_88._0_8_);
  }
  operator_delete((void *)uVar3,0x38);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_78);
  Gudhi::persistence_matrix::
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>_>,_std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>_>_>_>,_false,_unsigned_int>
  ::~Matrix_row_access
            ((Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>_>,_std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false>_>_>_>_>_>_>,_false,_unsigned_int>
              *)(local_88 + 8));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_a0);
  return;
}

Assistant:

void test_base_z2_row_access() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<std::vector<unsigned int> > rows;
  if constexpr (Matrix::Option_list::has_column_compression) {
    // if the union find structure changes, the column_index values of the entries could also change. Change the test
    // with all possibilities?
    rows.push_back({3, 6});
    rows.push_back({3, 5});
    rows.push_back({5});
    rows.push_back({7});
    rows.push_back({3, 6, 7});
    rows.push_back({7});
  } else {
    rows.push_back({3, 6, 9, 10, 11});
    rows.push_back({3, 5, 8, 9, 11});
    rows.push_back({5, 8});
    rows.push_back({7});
    rows.push_back({3, 6, 7, 9, 10, 11});
    rows.push_back({7});
  }

  unsigned int i = 0;
  for (auto& r : rows) {
    test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
  }
}